

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceArrayIntersector1MB>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  byte bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  bool bVar19;
  long lVar20;
  byte bVar21;
  AABBNodeMB4D *node1;
  ulong uVar22;
  byte bVar23;
  ulong uVar24;
  ulong *puVar25;
  uint uVar26;
  ulong uVar27;
  Primitive *prim;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2448 [16];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 == 8) {
    bVar18 = false;
  }
  else {
    local_2370[0] = 0;
    auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[0]));
    auVar51 = ZEXT3264(auVar30);
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_2448 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar3 = (context->query_radius).field_0;
      local_2448 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    }
    puVar25 = local_2368;
    auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.x));
    auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.y));
    auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.z));
    auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
    auVar53 = ZEXT3264(auVar34);
    auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
    auVar55 = ZEXT3264(auVar34);
    auVar29 = vmulss_avx512f(auVar30._0_16_,auVar30._0_16_);
    auVar30._0_4_ = auVar29._0_4_;
    auVar30._4_4_ = auVar30._0_4_;
    auVar30._8_4_ = auVar30._0_4_;
    auVar30._12_4_ = auVar30._0_4_;
    auVar30._16_4_ = auVar30._0_4_;
    auVar30._20_4_ = auVar30._0_4_;
    auVar30._24_4_ = auVar30._0_4_;
    auVar30._28_4_ = auVar30._0_4_;
    bVar18 = false;
    auVar34 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar56 = ZEXT3264(auVar34);
    auVar34 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar57 = ZEXT3264(auVar34);
    do {
      auVar50 = auVar51._0_32_;
      auVar34 = vsubps_avx512vl(auVar31,auVar50);
      auVar35 = vaddps_avx512vl(auVar31,auVar50);
      auVar52 = auVar53._0_32_;
      auVar36 = vsubps_avx512vl(auVar32,auVar52);
      auVar37 = vaddps_avx512vl(auVar32,auVar52);
      auVar54 = auVar55._0_32_;
      auVar38 = vsubps_avx512vl(auVar33,auVar54);
      auVar39 = vaddps_avx512vl(auVar33,auVar54);
LAB_01f34f05:
      pfVar1 = (float *)(puVar25 + -1);
      puVar25 = puVar25 + -2;
      if (*pfVar1 <= (float)local_2448._0_4_) {
        uVar27 = *puVar25;
        do {
          do {
            uVar26 = (uint)uVar27;
            if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
              if ((uVar27 & 8) != 0) {
LAB_01f3547e:
                lVar20 = (ulong)(uVar26 & 0xf) - 8;
                if (lVar20 != 0) {
                  prim = (Primitive *)(uVar27 & 0xfffffffffffffff0);
                  bVar23 = 0;
                  do {
                    bVar21 = bVar23;
                    bVar19 = InstanceArrayIntersector1MB::pointQuery(query,context,prim);
                    prim = prim + 1;
                    lVar20 = lVar20 + -1;
                    bVar23 = bVar21 | bVar19;
                  } while (lVar20 != 0);
                  if (bVar21 == 0 && !bVar19) {
                    auVar51 = ZEXT3264(auVar50);
                    auVar53 = ZEXT3264(auVar52);
                    auVar55 = ZEXT3264(auVar54);
                    auVar30 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar56 = ZEXT3264(auVar30);
                    auVar30 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar57 = ZEXT3264(auVar30);
                  }
                  else {
                    auVar30 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(context->query_radius).field_0.m128[0]));
                    auVar51 = ZEXT3264(auVar30);
                    auVar30 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(context->query_radius).field_0.m128[1]));
                    auVar53 = ZEXT3264(auVar30);
                    auVar30 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(context->query_radius).field_0.m128[2]));
                    auVar55 = ZEXT3264(auVar30);
                    auVar30 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar56 = ZEXT3264(auVar30);
                    auVar30 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar57 = ZEXT3264(auVar30);
                    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
                      local_2448 = ZEXT416((uint)(query->radius * query->radius));
                    }
                    else {
                      aVar3 = (context->query_radius).field_0;
                      local_2448 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
                    }
                    bVar18 = true;
                  }
                }
                goto LAB_01f35590;
              }
              uVar22 = uVar27 & 0xfffffffffffffff0;
              fVar2 = query->time;
              auVar46._4_4_ = fVar2;
              auVar46._0_4_ = fVar2;
              auVar46._8_4_ = fVar2;
              auVar46._12_4_ = fVar2;
              auVar46._16_4_ = fVar2;
              auVar46._20_4_ = fVar2;
              auVar46._24_4_ = fVar2;
              auVar46._28_4_ = fVar2;
              auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x100),auVar46,
                                        *(undefined1 (*) [32])(uVar22 + 0x40));
              auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x140),auVar46,
                                        *(undefined1 (*) [32])(uVar22 + 0x80));
              auVar14 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x180),auVar46,
                                        *(undefined1 (*) [32])(uVar22 + 0xc0));
              auVar15 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x120),auVar46,
                                        *(undefined1 (*) [32])(uVar22 + 0x60));
              auVar16 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x160),auVar46,
                                        *(undefined1 (*) [32])(uVar22 + 0xa0));
              auVar17 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x1a0),auVar46,
                                        *(undefined1 (*) [32])(uVar22 + 0xe0));
              auVar40 = vmaxps_avx512vl(auVar31,ZEXT1632(auVar29));
              auVar40 = vminps_avx(auVar40,ZEXT1632(auVar15));
              auVar41 = vsubps_avx512vl(auVar40,auVar31);
              auVar40 = vmaxps_avx512vl(auVar32,ZEXT1632(auVar13));
              auVar40 = vminps_avx(auVar40,ZEXT1632(auVar16));
              auVar42 = vsubps_avx512vl(auVar40,auVar32);
              auVar40 = vmaxps_avx512vl(auVar33,ZEXT1632(auVar14));
              auVar40 = vminps_avx(auVar40,ZEXT1632(auVar17));
              auVar40 = vsubps_avx512vl(auVar40,auVar33);
              auVar48._0_4_ =
                   auVar40._0_4_ * auVar40._0_4_ +
                   auVar41._0_4_ * auVar41._0_4_ + auVar42._0_4_ * auVar42._0_4_;
              auVar48._4_4_ =
                   auVar40._4_4_ * auVar40._4_4_ +
                   auVar41._4_4_ * auVar41._4_4_ + auVar42._4_4_ * auVar42._4_4_;
              auVar48._8_4_ =
                   auVar40._8_4_ * auVar40._8_4_ +
                   auVar41._8_4_ * auVar41._8_4_ + auVar42._8_4_ * auVar42._8_4_;
              auVar48._12_4_ =
                   auVar40._12_4_ * auVar40._12_4_ +
                   auVar41._12_4_ * auVar41._12_4_ + auVar42._12_4_ * auVar42._12_4_;
              auVar48._16_4_ =
                   auVar40._16_4_ * auVar40._16_4_ +
                   auVar41._16_4_ * auVar41._16_4_ + auVar42._16_4_ * auVar42._16_4_;
              auVar48._20_4_ =
                   auVar40._20_4_ * auVar40._20_4_ +
                   auVar41._20_4_ * auVar41._20_4_ + auVar42._20_4_ * auVar42._20_4_;
              auVar48._24_4_ =
                   auVar40._24_4_ * auVar40._24_4_ +
                   auVar41._24_4_ * auVar41._24_4_ + auVar42._24_4_ * auVar42._24_4_;
              auVar48._28_4_ = auVar40._28_4_ + auVar42._28_4_ + 0.0;
              uVar28 = vcmpps_avx512vl(auVar48,auVar30,2);
              uVar24 = vcmpps_avx512vl(ZEXT1632(auVar29),ZEXT1632(auVar15),2);
              uVar28 = uVar28 & uVar24;
              if ((uVar26 & 7) == 6) {
                uVar11 = vcmpps_avx512vl(auVar46,*(undefined1 (*) [32])(uVar22 + 0x1c0),0xd);
                uVar10 = vcmpps_avx512vl(auVar46,*(undefined1 (*) [32])(uVar22 + 0x1e0),1);
                uVar28 = (ulong)(byte)((byte)uVar11 & (byte)uVar10 & (byte)uVar28);
              }
            }
            else {
              if ((uVar27 & 8) != 0) goto LAB_01f3547e;
              uVar24 = uVar27 & 0xfffffffffffffff0;
              fVar2 = query->time;
              auVar43._4_4_ = fVar2;
              auVar43._0_4_ = fVar2;
              auVar43._8_4_ = fVar2;
              auVar43._12_4_ = fVar2;
              auVar43._16_4_ = fVar2;
              auVar43._20_4_ = fVar2;
              auVar43._24_4_ = fVar2;
              auVar43._28_4_ = fVar2;
              auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100),auVar43,
                                        *(undefined1 (*) [32])(uVar24 + 0x40));
              auVar13 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x140),auVar43,
                                        *(undefined1 (*) [32])(uVar24 + 0x80));
              auVar14 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x180),auVar43,
                                        *(undefined1 (*) [32])(uVar24 + 0xc0));
              auVar15 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x120),auVar43,
                                        *(undefined1 (*) [32])(uVar24 + 0x60));
              auVar16 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x160),auVar43,
                                        *(undefined1 (*) [32])(uVar24 + 0xa0));
              auVar17 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x1a0),auVar43,
                                        *(undefined1 (*) [32])(uVar24 + 0xe0));
              auVar40 = vmaxps_avx512vl(auVar31,ZEXT1632(auVar29));
              auVar40 = vminps_avx(auVar40,ZEXT1632(auVar15));
              auVar41 = vsubps_avx512vl(auVar40,auVar31);
              auVar40 = vmaxps_avx512vl(auVar32,ZEXT1632(auVar13));
              auVar40 = vminps_avx(auVar40,ZEXT1632(auVar16));
              auVar40 = vsubps_avx512vl(auVar40,auVar32);
              auVar42 = vmaxps_avx512vl(auVar33,ZEXT1632(auVar14));
              auVar42 = vminps_avx512vl(auVar42,ZEXT1632(auVar17));
              auVar42 = vsubps_avx512vl(auVar42,auVar33);
              auVar42 = vmulps_avx512vl(auVar42,auVar42);
              auVar48._0_4_ =
                   auVar42._0_4_ + auVar40._0_4_ * auVar40._0_4_ + auVar41._0_4_ * auVar41._0_4_;
              auVar48._4_4_ =
                   auVar42._4_4_ + auVar40._4_4_ * auVar40._4_4_ + auVar41._4_4_ * auVar41._4_4_;
              auVar48._8_4_ =
                   auVar42._8_4_ + auVar40._8_4_ * auVar40._8_4_ + auVar41._8_4_ * auVar41._8_4_;
              auVar48._12_4_ =
                   auVar42._12_4_ +
                   auVar40._12_4_ * auVar40._12_4_ + auVar41._12_4_ * auVar41._12_4_;
              auVar48._16_4_ =
                   auVar42._16_4_ +
                   auVar40._16_4_ * auVar40._16_4_ + auVar41._16_4_ * auVar41._16_4_;
              auVar48._20_4_ =
                   auVar42._20_4_ +
                   auVar40._20_4_ * auVar40._20_4_ + auVar41._20_4_ * auVar41._20_4_;
              auVar48._24_4_ =
                   auVar42._24_4_ +
                   auVar40._24_4_ * auVar40._24_4_ + auVar41._24_4_ * auVar41._24_4_;
              auVar48._28_4_ = auVar42._28_4_ + auVar40._28_4_ + auVar41._28_4_;
              uVar11 = vcmpps_avx512vl(ZEXT1632(auVar29),ZEXT1632(auVar15),2);
              uVar10 = vcmpps_avx512vl(ZEXT1632(auVar15),auVar34,1);
              uVar5 = vcmpps_avx512vl(ZEXT1632(auVar29),auVar35,6);
              uVar6 = vcmpps_avx512vl(ZEXT1632(auVar16),auVar36,1);
              uVar7 = vcmpps_avx512vl(ZEXT1632(auVar13),auVar37,6);
              uVar8 = vcmpps_avx512vl(ZEXT1632(auVar17),auVar38,1);
              uVar9 = vcmpps_avx512vl(ZEXT1632(auVar14),auVar39,6);
              bVar23 = ~((byte)uVar7 | (byte)uVar5 | (byte)uVar9 | (byte)uVar10 |
                        (byte)uVar6 | (byte)uVar8) & (byte)uVar11;
              uVar28 = (ulong)bVar23;
              if ((uVar26 & 7) == 6) {
                uVar11 = vcmpps_avx512vl(auVar43,*(undefined1 (*) [32])(uVar24 + 0x1e0),1);
                uVar10 = vcmpps_avx512vl(auVar43,*(undefined1 (*) [32])(uVar24 + 0x1c0),0xd);
                uVar28 = (ulong)(bVar23 & (byte)uVar11 & (byte)uVar10);
              }
            }
            bVar23 = (byte)uVar28;
            if (bVar23 == 0) {
              if (puVar25 == &local_2378) {
                return bVar18;
              }
              goto LAB_01f34f05;
            }
            auVar40 = *(undefined1 (*) [32])(uVar27 & 0xfffffffffffffff0);
            auVar41 = ((undefined1 (*) [32])(uVar27 & 0xfffffffffffffff0))[1];
            auVar42 = vmovdqa64_avx512vl(auVar56._0_32_);
            auVar42 = vpternlogd_avx512vl(auVar42,auVar48,auVar57._0_32_,0xf8);
            auVar43 = vpcompressd_avx512vl(auVar42);
            auVar45._0_4_ =
                 (uint)(bVar23 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar23 & 1) * auVar42._0_4_;
            bVar19 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar45._4_4_ = (uint)bVar19 * auVar43._4_4_ | (uint)!bVar19 * auVar42._4_4_;
            bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar45._8_4_ = (uint)bVar19 * auVar43._8_4_ | (uint)!bVar19 * auVar42._8_4_;
            bVar19 = (bool)((byte)(uVar28 >> 3) & 1);
            auVar45._12_4_ = (uint)bVar19 * auVar43._12_4_ | (uint)!bVar19 * auVar42._12_4_;
            bVar19 = (bool)((byte)(uVar28 >> 4) & 1);
            auVar45._16_4_ = (uint)bVar19 * auVar43._16_4_ | (uint)!bVar19 * auVar42._16_4_;
            bVar19 = (bool)((byte)(uVar28 >> 5) & 1);
            auVar45._20_4_ = (uint)bVar19 * auVar43._20_4_ | (uint)!bVar19 * auVar42._20_4_;
            bVar19 = (bool)((byte)(uVar28 >> 6) & 1);
            auVar45._24_4_ = (uint)bVar19 * auVar43._24_4_ | (uint)!bVar19 * auVar42._24_4_;
            bVar19 = SUB81(uVar28 >> 7,0);
            auVar45._28_4_ = (uint)bVar19 * auVar43._28_4_ | (uint)!bVar19 * auVar42._28_4_;
            auVar42 = vpermt2q_avx512vl(auVar40,auVar45,auVar41);
            uVar27 = auVar42._0_8_;
            bVar23 = bVar23 - 1 & bVar23;
          } while (bVar23 == 0);
          auVar42 = vpshufd_avx2(auVar45,0x55);
          vpermt2q_avx512vl(auVar40,auVar42,auVar41);
          auVar43 = vpminsd_avx2(auVar45,auVar42);
          auVar42 = vpmaxsd_avx2(auVar45,auVar42);
          bVar23 = bVar23 - 1 & bVar23;
          if (bVar23 == 0) {
            auVar43 = vpermi2q_avx512vl(auVar43,auVar40,auVar41);
            uVar27 = auVar43._0_8_;
            auVar40 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
            *puVar25 = auVar40._0_8_;
            auVar40 = vpermd_avx2(auVar42,auVar48);
            *(int *)(puVar25 + 1) = auVar40._0_4_;
            puVar25 = puVar25 + 2;
          }
          else {
            auVar47 = vpshufd_avx2(auVar45,0xaa);
            vpermt2q_avx512vl(auVar40,auVar47,auVar41);
            auVar46 = vpminsd_avx2(auVar43,auVar47);
            auVar43 = vpmaxsd_avx2(auVar43,auVar47);
            auVar47 = vpminsd_avx2(auVar42,auVar43);
            auVar42 = vpmaxsd_avx2(auVar42,auVar43);
            bVar23 = bVar23 - 1 & bVar23;
            if (bVar23 == 0) {
              auVar43 = vpermi2q_avx512vl(auVar46,auVar40,auVar41);
              uVar27 = auVar43._0_8_;
              auVar43 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
              *puVar25 = auVar43._0_8_;
              auVar42 = vpermd_avx2(auVar42,auVar48);
              *(int *)(puVar25 + 1) = auVar42._0_4_;
              auVar40 = vpermt2q_avx512vl(auVar40,auVar47,auVar41);
              puVar25[2] = auVar40._0_8_;
              auVar40 = vpermd_avx2(auVar47,auVar48);
              *(int *)(puVar25 + 3) = auVar40._0_4_;
              puVar25 = puVar25 + 4;
            }
            else {
              auVar43 = vpshufd_avx2(auVar45,0xff);
              vpermt2q_avx512vl(auVar40,auVar43,auVar41);
              auVar4 = vpminsd_avx2(auVar46,auVar43);
              auVar43 = vpmaxsd_avx2(auVar46,auVar43);
              auVar46 = vpminsd_avx2(auVar47,auVar43);
              auVar43 = vpmaxsd_avx2(auVar47,auVar43);
              auVar47 = vpminsd_avx2(auVar42,auVar43);
              auVar42 = vpmaxsd_avx2(auVar42,auVar43);
              bVar23 = bVar23 - 1 & bVar23;
              if (bVar23 == 0) {
                auVar43 = vpermi2q_avx512vl(auVar4,auVar40,auVar41);
                uVar27 = auVar43._0_8_;
                auVar43 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
                *puVar25 = auVar43._0_8_;
                auVar42 = vpermd_avx2(auVar42,auVar48);
                *(int *)(puVar25 + 1) = auVar42._0_4_;
                auVar42 = vpermt2q_avx512vl(auVar40,auVar47,auVar41);
                puVar25[2] = auVar42._0_8_;
                auVar42 = vpermd_avx2(auVar47,auVar48);
                *(int *)(puVar25 + 3) = auVar42._0_4_;
                auVar40 = vpermt2q_avx512vl(auVar40,auVar46,auVar41);
                puVar25[4] = auVar40._0_8_;
                auVar40 = vpermd_avx2(auVar46,auVar48);
                *(int *)(puVar25 + 5) = auVar40._0_4_;
                puVar25 = puVar25 + 6;
              }
              else {
                auVar44 = valignd_avx512vl(auVar45,auVar45,3);
                auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                auVar45 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                               CONCAT48(0x80000000,
                                                                        0x8000000080000000))),
                                            auVar43,auVar4);
                auVar43 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar46 = vpermt2d_avx512vl(auVar45,auVar43,auVar46);
                auVar46 = vpermt2d_avx512vl(auVar46,auVar43,auVar47);
                auVar43 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar42 = vpermt2d_avx512vl(auVar46,auVar43,auVar42);
                auVar49 = ZEXT3264(auVar42);
                bVar21 = bVar23;
                do {
                  auVar43 = auVar49._0_32_;
                  auVar42._8_4_ = 1;
                  auVar42._0_8_ = 0x100000001;
                  auVar42._12_4_ = 1;
                  auVar42._16_4_ = 1;
                  auVar42._20_4_ = 1;
                  auVar42._24_4_ = 1;
                  auVar42._28_4_ = 1;
                  auVar42 = vpermd_avx2(auVar42,auVar44);
                  auVar44 = valignd_avx512vl(auVar44,auVar44,1);
                  vpermt2q_avx512vl(auVar40,auVar44,auVar41);
                  bVar21 = bVar21 - 1 & bVar21;
                  uVar11 = vpcmpd_avx512vl(auVar42,auVar43,5);
                  auVar42 = vpmaxsd_avx2(auVar42,auVar43);
                  bVar12 = (byte)uVar11 << 1;
                  auVar43 = valignd_avx512vl(auVar43,auVar43,7);
                  bVar19 = (bool)((byte)uVar11 & 1);
                  auVar47._4_4_ = (uint)bVar19 * auVar43._4_4_ | (uint)!bVar19 * auVar42._4_4_;
                  auVar47._0_4_ = auVar42._0_4_;
                  bVar19 = (bool)(bVar12 >> 2 & 1);
                  auVar47._8_4_ = (uint)bVar19 * auVar43._8_4_ | (uint)!bVar19 * auVar42._8_4_;
                  bVar19 = (bool)(bVar12 >> 3 & 1);
                  auVar47._12_4_ = (uint)bVar19 * auVar43._12_4_ | (uint)!bVar19 * auVar42._12_4_;
                  bVar19 = (bool)(bVar12 >> 4 & 1);
                  auVar47._16_4_ = (uint)bVar19 * auVar43._16_4_ | (uint)!bVar19 * auVar42._16_4_;
                  bVar19 = (bool)(bVar12 >> 5 & 1);
                  auVar47._20_4_ = (uint)bVar19 * auVar43._20_4_ | (uint)!bVar19 * auVar42._20_4_;
                  bVar19 = (bool)(bVar12 >> 6 & 1);
                  auVar47._24_4_ = (uint)bVar19 * auVar43._24_4_ | (uint)!bVar19 * auVar42._24_4_;
                  auVar47._28_4_ =
                       (uint)(bVar12 >> 7) * auVar43._28_4_ |
                       (uint)!(bool)(bVar12 >> 7) * auVar42._28_4_;
                  auVar49 = ZEXT3264(auVar47);
                } while (bVar21 != 0);
                lVar20 = (ulong)(uint)POPCOUNT((uint)bVar23) + 3;
                do {
                  auVar42 = vpermi2q_avx512vl(auVar47,auVar40,auVar41);
                  *puVar25 = auVar42._0_8_;
                  auVar43 = auVar49._0_32_;
                  auVar42 = vpermd_avx2(auVar43,auVar48);
                  *(int *)(puVar25 + 1) = auVar42._0_4_;
                  auVar47 = valignd_avx512vl(auVar43,auVar43,1);
                  puVar25 = puVar25 + 2;
                  auVar49 = ZEXT3264(auVar47);
                  lVar20 = lVar20 + -1;
                } while (lVar20 != 0);
                auVar40 = vpermt2q_avx512vl(auVar40,auVar47,auVar41);
                uVar27 = auVar40._0_8_;
              }
            }
          }
        } while( true );
      }
LAB_01f35590:
      auVar30 = vmulps_avx512vl(auVar51._0_32_,auVar51._0_32_);
    } while (puVar25 != &local_2378);
  }
  return bVar18;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }